

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O0

void __thiscall aabb::aabb(aabb *this,point3 *a,point3 *b)

{
  double dVar1;
  double dVar2;
  interval local_50;
  interval local_40;
  interval local_30;
  point3 *local_20;
  point3 *b_local;
  point3 *a_local;
  aabb *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (point3 *)this;
  interval::interval(&this->x);
  interval::interval(&this->y);
  interval::interval(&this->z);
  dVar1 = vec3::operator[](b_local,0);
  dVar2 = vec3::operator[](local_20,0);
  if (dVar2 < dVar1) {
    dVar1 = vec3::operator[](local_20,0);
    dVar2 = vec3::operator[](b_local,0);
    interval::interval(&local_30,dVar1,dVar2);
  }
  else {
    dVar1 = vec3::operator[](b_local,0);
    dVar2 = vec3::operator[](local_20,0);
    interval::interval(&local_30,dVar1,dVar2);
  }
  (this->x).min = local_30.min;
  (this->x).max = local_30.max;
  dVar1 = vec3::operator[](b_local,1);
  dVar2 = vec3::operator[](local_20,1);
  if (dVar2 < dVar1) {
    dVar1 = vec3::operator[](local_20,1);
    dVar2 = vec3::operator[](b_local,1);
    interval::interval(&local_40,dVar1,dVar2);
  }
  else {
    dVar1 = vec3::operator[](b_local,1);
    dVar2 = vec3::operator[](local_20,1);
    interval::interval(&local_40,dVar1,dVar2);
  }
  (this->y).min = local_40.min;
  (this->y).max = local_40.max;
  dVar1 = vec3::operator[](b_local,2);
  dVar2 = vec3::operator[](local_20,2);
  if (dVar2 < dVar1) {
    dVar1 = vec3::operator[](local_20,2);
    dVar2 = vec3::operator[](b_local,2);
    interval::interval(&local_50,dVar1,dVar2);
  }
  else {
    dVar1 = vec3::operator[](b_local,2);
    dVar2 = vec3::operator[](local_20,2);
    interval::interval(&local_50,dVar1,dVar2);
  }
  (this->z).min = local_50.min;
  (this->z).max = local_50.max;
  pad_to_minimums(this);
  return;
}

Assistant:

aabb(const point3& a, const point3& b) {
        // Treat the two points a and b as extrema for the bounding box, so we don't require a
        // particular minimum/maximum coordinate order.

        x = (a[0] <= b[0]) ? interval(a[0], b[0]) : interval(b[0], a[0]);
        y = (a[1] <= b[1]) ? interval(a[1], b[1]) : interval(b[1], a[1]);
        z = (a[2] <= b[2]) ? interval(a[2], b[2]) : interval(b[2], a[2]);

        pad_to_minimums();
    }